

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

void __thiscall FTraceInfo::Setup3DFloors(FTraceInfo *this)

{
  uint uVar1;
  extsector_t *peVar2;
  F3DFloor **ppFVar3;
  F3DFloor *pFVar4;
  FTraceResults *pFVar5;
  secplane_t *psVar6;
  sector_t *psVar7;
  double dVar8;
  bool bVar9;
  long lVar10;
  double dVar11;
  double local_78;
  double local_70;
  DVector2 local_68;
  double local_58;
  double dStack_50;
  double local_40;
  double local_38;
  
  peVar2 = this->CurSector->e;
  if ((peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    memcpy(this->DummySector,this->CurSector,0x268);
    this->CurSector = this->DummySector;
    this->sectorsel = 1;
    dVar11 = this->MaxDist * this->startfrac;
    local_40 = (this->Vec).Z * dVar11 + (this->Start).Z;
    local_68.X = dVar11 * (this->Vec).X + (this->Start).X;
    local_68.Y = dVar11 * (this->Vec).Y + (this->Start).Y;
    local_58 = local_68.X;
    dStack_50 = local_68.Y;
    local_78 = secplane_t::ZatPoint(&this->DummySector[0].floorplane,&local_68);
    local_68.X = local_58;
    local_68.Y = dStack_50;
    local_70 = secplane_t::ZatPoint(&this->CurSector->ceilingplane,&local_68);
    ppFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar1 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar10 = 0; (ulong)uVar1 << 3 != lVar10; lVar10 = lVar10 + 8) {
      pFVar4 = *(F3DFloor **)((long)ppFVar3 + lVar10);
      if ((pFVar4->flags & 1) != 0) {
        if (((pFVar4->flags & 0x10) != 0) && (this->Results->Crossed3DWater == (F3DFloor *)0x0)) {
          bVar9 = CheckPlane(this,(pFVar4->top).plane);
          if (bVar9) {
            local_68.X = (this->Results->HitPos).X;
            local_68.Y = (this->Results->HitPos).Y;
            dVar11 = secplane_t::ZatPoint((pFVar4->top).plane,&local_68);
            if (local_78 < dVar11) {
              pFVar5 = this->Results;
              pFVar5->Crossed3DWater = pFVar4;
              (pFVar5->Crossed3DWaterPos).Z = (pFVar5->HitPos).Z;
              dVar11 = (pFVar5->HitPos).Y;
              (pFVar5->Crossed3DWaterPos).X = (pFVar5->HitPos).X;
              (pFVar5->Crossed3DWaterPos).Y = dVar11;
              pFVar5->Distance = 0.0;
            }
          }
        }
        if ((pFVar4->flags & 0x4000000) == 0) {
          local_68.X = local_58;
          local_68.Y = dStack_50;
          local_38 = secplane_t::ZatPoint((pFVar4->bottom).plane,&local_68);
          local_68.X = local_58;
          local_68.Y = dStack_50;
          dVar11 = secplane_t::ZatPoint((pFVar4->top).plane,&local_68);
          if (local_40 <= dVar11) {
            if (local_38 <= local_40) {
              if (local_78 < local_38) {
                psVar6 = (pFVar4->bottom).plane;
                psVar7 = this->CurSector;
                (psVar7->floorplane).normal.Z = (psVar6->normal).Z;
                dVar8 = (psVar6->normal).Y;
                (psVar7->floorplane).normal.X = (psVar6->normal).X;
                (psVar7->floorplane).normal.Y = dVar8;
                dVar8 = psVar6->negiC;
                (psVar7->floorplane).D = psVar6->D;
                (psVar7->floorplane).negiC = dVar8;
                psVar7 = this->CurSector;
                psVar7->planes[0].Texture.texnum = ((pFVar4->bottom).texture)->texnum;
                psVar7->Portals[0] = 0;
                psVar7->portals[0] = (FPortal *)0x0;
                local_78 = local_38;
              }
              if (dVar11 < local_70) {
                psVar6 = (pFVar4->top).plane;
                psVar7 = this->CurSector;
                (psVar7->ceilingplane).normal.Z = (psVar6->normal).Z;
                dVar8 = (psVar6->normal).Y;
                (psVar7->ceilingplane).normal.X = (psVar6->normal).X;
                (psVar7->ceilingplane).normal.Y = dVar8;
                dVar8 = psVar6->negiC;
                (psVar7->ceilingplane).D = psVar6->D;
                (psVar7->ceilingplane).negiC = dVar8;
                psVar7 = this->CurSector;
                psVar7->planes[1].Texture.texnum = ((pFVar4->top).texture)->texnum;
                psVar7->Portals[1] = 0;
                psVar7->portals[1] = (FPortal *)0x0;
                local_70 = dVar11;
              }
              this->inshootthrough = 0;
            }
            else if (local_38 < local_70) {
              psVar6 = (pFVar4->bottom).plane;
              psVar7 = this->CurSector;
              (psVar7->ceilingplane).normal.Z = (psVar6->normal).Z;
              dVar11 = (psVar6->normal).Y;
              (psVar7->ceilingplane).normal.X = (psVar6->normal).X;
              (psVar7->ceilingplane).normal.Y = dVar11;
              dVar11 = psVar6->negiC;
              (psVar7->ceilingplane).D = psVar6->D;
              (psVar7->ceilingplane).negiC = dVar11;
              psVar7 = this->CurSector;
              psVar7->planes[1].Texture.texnum = ((pFVar4->bottom).texture)->texnum;
              psVar7->Portals[1] = 0;
              psVar7->portals[1] = (FPortal *)0x0;
              local_70 = local_38;
            }
          }
          else if (local_78 < dVar11) {
            psVar6 = (pFVar4->top).plane;
            psVar7 = this->CurSector;
            (psVar7->floorplane).normal.Z = (psVar6->normal).Z;
            dVar8 = (psVar6->normal).Y;
            (psVar7->floorplane).normal.X = (psVar6->normal).X;
            (psVar7->floorplane).normal.Y = dVar8;
            dVar8 = psVar6->negiC;
            (psVar7->floorplane).D = psVar6->D;
            (psVar7->floorplane).negiC = dVar8;
            psVar7 = this->CurSector;
            psVar7->planes[0].Texture.texnum = ((pFVar4->top).texture)->texnum;
            psVar7->Portals[0] = 0;
            psVar7->portals[0] = (FPortal *)0x0;
            local_78 = dVar11;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FTraceInfo::Setup3DFloors()
{
	TDeletingArray<F3DFloor*> &ff = CurSector->e->XFloor.ffloors;

	if (ff.Size())
	{
		memcpy(&DummySector[0], CurSector, sizeof(sector_t));
		CurSector = &DummySector[0];
		sectorsel = 1;

		double sdist = MaxDist * startfrac;
		DVector3 pos = Start + Vec * sdist;


		double bf = CurSector->floorplane.ZatPoint(pos);
		double bc = CurSector->ceilingplane.ZatPoint(pos);

		for (auto rover : ff)
		{
			if (!(rover->flags&FF_EXISTS))
				continue;

			if (rover->flags&FF_SWIMMABLE && Results->Crossed3DWater == NULL)
			{
				if (Check3DFloorPlane(rover, false))
				{
					// only consider if the plane is above the actual floor.
					if (rover->top.plane->ZatPoint(Results->HitPos) > bf)
					{
						Results->Crossed3DWater = rover;
						Results->Crossed3DWaterPos = Results->HitPos;
						Results->Distance = 0;
					}
				}
			}

			if (!(rover->flags&FF_SHOOTTHROUGH))
			{
				double ff_bottom = rover->bottom.plane->ZatPoint(pos);
				double ff_top = rover->top.plane->ZatPoint(pos);
				// clip to the part of the sector we are in
				if (pos.Z > ff_top)
				{
					// above
					if (bf < ff_top)
					{
						CurSector->floorplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::floor, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_top;
					}
				}
				else if (pos.Z < ff_bottom)
				{
					//below
					if (bc > ff_bottom)
					{
						CurSector->ceilingplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
						bc = ff_bottom;
						CurSector->ClearPortal(sector_t::ceiling);
					}
				}
				else
				{
					// inside
					if (bf < ff_bottom)
					{
						CurSector->floorplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::floor, *rover->bottom.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_bottom;
					}

					if (bc > ff_top)
					{
						CurSector->ceilingplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::ceiling);
						bc = ff_top;
					}
					inshootthrough = false;
				}
			}
		}
	}
}